

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

int handle_pp_identifier(Context_conflict1 *ctx)

{
  uint uVar1;
  IncludeState *pIVar2;
  MOJOSHADER_malloc p_Var3;
  IncludeState *state;
  void *pvVar4;
  MOJOSHADER_free p_Var5;
  bool bVar6;
  Buffer *pBVar7;
  uint uVar8;
  int iVar9;
  Token TVar10;
  Token TVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  Define *pDVar15;
  size_t sVar16;
  Define *pDVar17;
  Define *pDVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  IncludeState *pIVar22;
  IncludeState *pIVar23;
  int iVar24;
  char *sym;
  Context_conflict1 *pCVar25;
  char *pcVar26;
  ulong uVar27;
  byte bVar28;
  undefined8 uStack_100;
  char local_f8 [104];
  char *local_90;
  size_t local_88;
  long local_80;
  Define *local_78;
  int local_70;
  int local_6c;
  long local_68;
  char *local_60;
  undefined8 local_58;
  Define *local_50;
  IncludeState *local_48;
  Context_conflict1 *local_40;
  Buffer *local_38;
  
  bVar28 = 0;
  iVar19 = ctx->recursion_count;
  ctx->recursion_count = iVar19 + 1;
  if (0xff < iVar19) {
    uStack_100 = 0x12ff2b;
    failf(ctx,"%s","Recursing macros");
    return 0;
  }
  pIVar2 = ctx->include_stack;
  pcVar14 = pIVar2->filename;
  uVar8 = pIVar2->line;
  uVar1 = pIVar2->tokenlen;
  lVar21 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
  sym = local_f8 + lVar21;
  pcVar26 = pIVar2->token;
  *(undefined8 *)((long)&uStack_100 + lVar21) = 0x12ff66;
  memcpy(sym,pcVar26,(ulong)uVar1);
  sym[uVar1] = '\0';
  *(undefined8 *)((long)&uStack_100 + lVar21) = 0x12ff77;
  local_78 = find_define(ctx,sym);
  if (local_78 == (Define *)0x0) {
    return 0;
  }
  iVar19 = local_78->paramcount;
  if ((long)iVar19 == 0) {
    pcVar26 = local_78->definition;
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x12ffd8;
    sVar16 = strlen(pcVar26);
    iVar19 = push_source(ctx,pcVar14,pcVar26,(uint)sVar16,uVar8,(MOJOSHADER_includeClose)0x0);
    return iVar19;
  }
  local_80 = (long)iVar19;
  iVar9 = 0;
  if (0 < iVar19) {
    iVar9 = iVar19;
  }
  pIVar2 = ctx->include_stack;
  pIVar22 = pIVar2;
  pcVar14 = local_f8;
  for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(char **)pcVar14 = pIVar22->filename;
    pIVar22 = (IncludeState *)((long)pIVar22 + (ulong)bVar28 * -0x10 + 8);
    pcVar14 = pcVar14 + ((ulong)bVar28 * -2 + 1) * 8;
  }
  if (pIVar2->pushedback == 0) {
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130004;
    TVar11 = preprocessor_lexer(pIVar2);
  }
  else {
    pIVar2->pushedback = 0;
    TVar11 = pIVar2->tokenval;
  }
  if (TVar11 != 0x28) {
    pcVar14 = local_f8;
    pIVar22 = pIVar2;
    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
      pIVar22->filename = *(char **)pcVar14;
      pcVar14 = pcVar14 + ((ulong)bVar28 * -2 + 1) * 8;
      pIVar22 = (IncludeState *)((long)pIVar22 + (ulong)bVar28 * -0x10 + 8);
    }
    iVar19 = 0;
    goto LAB_00130654;
  }
  pIVar2->report_whitespace = 1;
  lVar20 = 0;
  local_50 = (Define *)0x0;
  local_58 = (char *)((ulong)local_58._4_4_ << 0x20);
  iVar24 = 1;
  local_90 = sym;
  local_70 = iVar9;
  local_40 = ctx;
  do {
    pCVar25 = local_40;
    local_68 = lVar20;
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130067;
    local_38 = buffer_create(0x80,MallocBridge,FreeBridge,pCVar25);
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13007e;
    local_48 = (IncludeState *)buffer_create(0x80,MallocBridge,FreeBridge,pCVar25);
    if (pIVar2->pushedback == 0) {
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13009f;
      TVar11 = preprocessor_lexer(pIVar2);
    }
    else {
      pIVar2->pushedback = 0;
      TVar11 = pIVar2->tokenval;
    }
    if ((int)local_58 != 0) {
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130815;
      __assert_fail("!void_call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x563,"int handle_macro_args(Context *, const char *, const Define *)");
    }
LAB_001300ab:
    pBVar7 = local_38;
    pCVar25 = local_40;
    pIVar22 = local_48;
    pcVar14 = pIVar2->token;
    uVar8 = pIVar2->tokenlen;
    sVar12 = (size_t)uVar8;
    pcVar26 = pcVar14;
    if ((int)TVar11 < 0x2c) {
      if (TVar11 == 0x20) {
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13013f;
        sVar12 = buffer_size((Buffer *)pIVar22);
        pBVar7 = local_38;
        sVar12 = (size_t)(sVar12 != 0);
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130150;
        sVar13 = buffer_size(pBVar7);
        uVar8 = (uint)(sVar13 != 0);
        pcVar14 = " ";
        pcVar26 = " ";
        goto LAB_00130178;
      }
      if (TVar11 == 0x28) {
        iVar24 = iVar24 + 1;
        goto LAB_0013016f;
      }
      if ((TVar11 == 0x29) && (iVar19 = iVar24 + -1, bVar6 = iVar24 < 2, iVar24 = iVar19, bVar6))
      goto LAB_001301f1;
LAB_0013016f:
      if (pcVar26 == (char *)0x0) {
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1307f6;
        __assert_fail("expr != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x597,"int handle_macro_args(Context *, const char *, const Define *)");
      }
LAB_00130178:
      pBVar7 = local_38;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130186;
      iVar9 = buffer_append(pBVar7,pcVar26,(ulong)uVar8);
      pIVar22 = local_48;
      iVar19 = 0;
      pDVar15 = local_50;
      pCVar25 = local_40;
      if (iVar9 == 0) goto joined_r0x00130634;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13019f;
      iVar9 = buffer_append((Buffer *)pIVar22,pcVar14,sVar12);
      pDVar15 = local_50;
      pCVar25 = local_40;
      if (iVar9 == 0) goto joined_r0x00130634;
      if (pIVar2->pushedback == 0) {
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1301c7;
        TVar11 = preprocessor_lexer(pIVar2);
      }
      else {
        pIVar2->pushedback = 0;
        TVar11 = pIVar2->tokenval;
      }
      goto LAB_001300ab;
    }
    if (0x100 < (int)TVar11) {
      if (TVar11 == TOKEN_IDENTIFIER) {
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130108;
        pDVar15 = find_define_by_token(pCVar25);
        if ((pDVar15 != (Define *)0x0) && (pDVar15->paramcount == 0)) {
          pcVar26 = pDVar15->definition;
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13011f;
          sVar16 = strlen(pcVar26);
          uVar8 = (uint)sVar16;
        }
      }
      else if ((TVar11 == TOKEN_EOI) || (TVar11 == TOKEN_INCOMPLETE_COMMENT)) {
        if (pIVar2->pushedback != 0) goto LAB_00130815;
        pIVar2->pushedback = 1;
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1306a0;
        failf(pCVar25,"%s","Unterminated macro list");
        goto LAB_001306a0;
      }
      goto LAB_0013016f;
    }
    if ((TVar11 != 0x2c) || (iVar24 != 1)) goto LAB_0013016f;
    iVar19 = 1;
LAB_001301f1:
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1301ff;
    sVar12 = buffer_size(pBVar7);
    pIVar22 = local_48;
    bVar6 = local_68 == 0;
    local_6c = iVar19;
    if (local_68 < local_80) {
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130224;
      local_88 = buffer_size((Buffer *)pIVar22);
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130230;
      local_58 = buffer_flatten((Buffer *)pIVar22);
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13023c;
      sVar13 = buffer_size(pBVar7);
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130247;
      pcVar14 = buffer_flatten(pBVar7);
      pDVar15 = local_40->define_pool;
      if (pDVar15 == (Define *)0x0) {
        pvVar4 = local_40->malloc_data;
        p_Var3 = local_40->malloc;
        local_60 = pcVar14;
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130286;
        pDVar15 = (Define *)(*p_Var3)(0x30,pvVar4);
        pcVar14 = local_60;
        if (pDVar15 != (Define *)0x0) goto LAB_00130296;
        local_40->out_of_memory = 1;
        pDVar15 = (Define *)0x0;
      }
      else {
        local_40->define_pool = pDVar15->next;
LAB_00130296:
        *(undefined8 *)&pDVar15->paramcount = 0;
        pDVar15->next = (Define *)0x0;
        pDVar15->original = (char *)0x0;
        pDVar15->parameters = (char **)0x0;
        pDVar15->identifier = (char *)0x0;
        pDVar15->definition = (char *)0x0;
        if ((local_58 != (char *)0x0) && (pcVar14 != (char *)0x0)) {
          if (0 < (int)(uint)sVar13) {
            uVar27 = (ulong)((uint)sVar13 & 0x7fffffff) + 1;
            do {
              if (pcVar14[uVar27 - 2] != ' ') break;
              pcVar14[uVar27 - 2] = '\0';
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
          if (0 < (int)(uint)local_88) {
            uVar27 = (ulong)((uint)local_88 & 0x7fffffff) + 1;
            do {
              if (local_58[uVar27 - 2] != ' ') break;
              local_58[uVar27 - 2] = '\0';
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
          pDVar15->identifier = local_78->parameters[local_68];
          pDVar15->definition = pcVar14;
          pDVar15->original = local_58;
          pDVar15->next = local_50;
          local_50 = pDVar15;
          goto LAB_00130330;
        }
      }
      local_60 = pcVar14;
      pCVar25 = local_40;
      pcVar14 = local_58;
      pvVar4 = local_40->malloc_data;
      p_Var5 = local_40->free;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1306f4;
      (*p_Var5)(pcVar14,pvVar4);
      pcVar14 = local_60;
      pvVar4 = pCVar25->malloc_data;
      p_Var5 = pCVar25->free;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130708;
      (*p_Var5)(pcVar14,pvVar4);
      pIVar22 = local_48;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130711;
      buffer_destroy((Buffer *)pIVar22);
      pBVar7 = local_38;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13071a;
      buffer_destroy(pBVar7);
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130725;
      free_define(pCVar25,pDVar15);
LAB_001306a0:
      iVar19 = 0;
      pDVar15 = local_50;
      goto joined_r0x00130634;
    }
LAB_00130330:
    pBVar7 = local_38;
    pDVar15 = local_50;
    lVar20 = local_68;
    local_58 = (char *)CONCAT44(local_58._4_4_,(uint)((sVar12 == 0 && bVar6) && iVar19 == 0));
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130342;
    buffer_destroy(pBVar7);
    pIVar22 = local_48;
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13034b;
    buffer_destroy((Buffer *)pIVar22);
    pCVar25 = local_40;
    pcVar14 = local_90;
    lVar20 = lVar20 + 1;
    iVar24 = local_6c;
  } while (0 < local_6c);
  if (local_6c != 0) {
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130853;
    __assert_fail("paren == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x5d4,"int handle_macro_args(Context *, const char *, const Define *)");
  }
  if (((((int)local_80 < 1) && (local_68 == 0)) && ((sVar12 == 0 && bVar6) && iVar19 == 0)) &&
     (lVar20 = 0, pDVar15 != (Define *)0x0)) {
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130872;
    __assert_fail("params == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x5d9,"int handle_macro_args(Context *, const char *, const Define *)");
  }
  if ((int)lVar20 == local_70) {
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1303ba;
    local_38 = buffer_create(0x80,MallocBridge,FreeBridge,pCVar25);
    if (local_38 != (Buffer *)0x0) {
      pIVar22 = pCVar25->include_stack;
      local_48 = (IncludeState *)pIVar22->filename;
      pcVar14 = local_78->definition;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1303e6;
      sVar16 = strlen(pcVar14);
      pCVar25 = local_40;
      pIVar23 = local_48;
      uVar8 = pIVar22->line;
      iVar19 = 0;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130402;
      iVar9 = push_source(pCVar25,(char *)pIVar23,pcVar14,(uint)sVar16,uVar8,
                          (MOJOSHADER_includeClose)0x0);
      pBVar7 = local_38;
      if (iVar9 == 0) {
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130736;
        buffer_destroy(pBVar7);
        pCVar25 = local_40;
        goto joined_r0x00130634;
      }
      pIVar22 = local_40->include_stack;
      do {
        if (pIVar22->pushedback == 0) {
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130432;
          TVar11 = preprocessor_lexer(pIVar22);
        }
        else {
          pIVar22->pushedback = 0;
          TVar11 = pIVar22->tokenval;
        }
        pBVar7 = local_38;
        if (TVar11 == TOKEN_EOI) {
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130744;
          pcVar14 = buffer_flatten(pBVar7);
          pBVar7 = local_38;
          if (pcVar14 != (char *)0x0) {
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130755;
            buffer_destroy(pBVar7);
            pCVar25 = local_40;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130761;
            pop_source(pCVar25);
            pIVar22 = pCVar25->include_stack;
            local_38 = (Buffer *)pIVar22->filename;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130777;
            sVar16 = strlen(pcVar14);
            pBVar7 = local_38;
            uVar8 = pIVar22->line;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130793;
            iVar9 = push_source(pCVar25,(char *)pBVar7,pcVar14,(uint)sVar16,uVar8,
                                close_define_include);
            pCVar25 = local_40;
            iVar19 = 1;
            if (iVar9 != 0) goto joined_r0x00130634;
            pvVar4 = local_40->malloc_data;
            p_Var5 = local_40->free;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1307b8;
            (*p_Var5)(pcVar14,pvVar4);
            goto LAB_001307cf;
          }
          break;
        }
        TVar11 = pIVar22->tokenval;
        if (TVar11 == TOKEN_HASHHASH) {
          if (pIVar22->pushedback == 0) {
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13049e;
            preprocessor_lexer(pIVar22);
            TVar10 = pIVar22->tokenval;
            if (TVar10 == TOKEN_EOI) {
              *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130891;
              __assert_fail("state->tokenval != TOKEN_EOI",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x4f6,
                            "int replace_and_push_macro(Context *, const Define *, const Define *)")
              ;
            }
            goto LAB_001304ad;
          }
          pIVar22->pushedback = 0;
          pDVar18 = (Define *)(ulong)pIVar22->tokenlen;
          pIVar23 = (IncludeState *)pIVar22->token;
LAB_001305f9:
          sVar12 = (ulong)pDVar18 & 0xffffffff;
        }
        else {
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13046e;
          sVar12 = buffer_size(pBVar7);
          pBVar7 = local_38;
          if (sVar12 != 0) {
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130488;
            iVar19 = buffer_append(pBVar7," ",1);
            if (iVar19 == 0) break;
          }
          TVar10 = pIVar22->tokenval;
LAB_001304ad:
          pIVar23 = (IncludeState *)pIVar22->token;
          pDVar18 = (Define *)(ulong)pIVar22->tokenlen;
          if (TVar10 == TOKEN_IDENTIFIER) {
            local_48 = pIVar23;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1304ed;
            pDVar17 = find_macro_arg(pIVar23,pDVar18);
            pIVar23 = local_48;
            if (pDVar17 != (Define *)0x0) {
              lVar20 = 0x10;
              if (TVar11 != TOKEN_HASHHASH) {
                if (pIVar22->pushedback == 0) {
                  *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1305c4;
                  TVar11 = preprocessor_lexer(pIVar22);
                  if (pIVar22->pushedback != 0) {
LAB_00130815:
                    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130834;
                    __assert_fail("!state->pushedback",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                  ,0x2d5,"void pushback(IncludeState *)");
                  }
                  pIVar22->pushedback = 1;
                }
                else {
                  TVar11 = pIVar22->tokenval;
                  pIVar22->pushedback = 1;
                }
                if (TVar11 != TOKEN_HASHHASH) {
                  lVar20 = 8;
                }
              }
              pIVar23 = *(IncludeState **)((long)&pDVar17->identifier + lVar20);
              *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1305f3;
              pDVar18 = (Define *)strlen((char *)pIVar23);
            }
            goto LAB_001305f9;
          }
          if (TVar10 != TOKEN_HASH) goto LAB_001305f9;
          if (pIVar22->pushedback == 0) {
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13053a;
            preprocessor_lexer(pIVar22);
            if (pIVar22->tokenval == TOKEN_EOI) {
              *(code **)((long)&uStack_100 + lVar21) = failf;
              __assert_fail("state->tokenval != TOKEN_EOI",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x507,
                            "int replace_and_push_macro(Context *, const Define *, const Define *)")
              ;
            }
          }
          else {
            pIVar22->pushedback = 0;
          }
          pBVar7 = local_38;
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13055d;
          iVar19 = buffer_append(pBVar7,"\"",1);
          if (iVar19 == 0) break;
          if (pIVar22->tokenval == TOKEN_IDENTIFIER) {
            state = (IncludeState *)pIVar22->token;
            uVar8 = pIVar22->tokenlen;
            *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13057f;
            pDVar17 = find_macro_arg(state,(Define *)(ulong)uVar8);
            if (pDVar17 != (Define *)0x0) {
              pIVar23 = (IncludeState *)pDVar17->original;
              *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130590;
              pDVar18 = (Define *)strlen((char *)pIVar23);
            }
          }
          pBVar7 = local_38;
          *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1305a2;
          iVar19 = buffer_append(pBVar7,pIVar23,(ulong)pDVar18 & 0xffffffff);
          if (iVar19 == 0) break;
          sVar12 = 1;
          pIVar23 = (IncludeState *)0x13c2ff;
        }
        pBVar7 = local_38;
        *(undefined8 *)((long)&uStack_100 + lVar21) = 0x130605;
        iVar19 = buffer_append(pBVar7,pIVar23,sVar12);
      } while (iVar19 != 0);
      pCVar25 = local_40;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1307c6;
      pop_source(pCVar25);
      pBVar7 = local_38;
      *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1307cf;
      buffer_destroy(pBVar7);
    }
LAB_001307cf:
    iVar19 = 0;
  }
  else {
    iVar19 = 0;
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x1306cb;
    failf(pCVar25,"macro \'%s\' passed %d arguments, but requires %d",pcVar14);
  }
joined_r0x00130634:
  while (pDVar15 != (Define *)0x0) {
    pDVar18 = pDVar15->next;
    pDVar15->identifier = (char *)0x0;
    *(undefined8 *)((long)&uStack_100 + lVar21) = 0x13064c;
    free_define(pCVar25,pDVar15);
    pDVar15 = pDVar18;
  }
LAB_00130654:
  pIVar2->report_whitespace = 0;
  return iVar19;
}

Assistant:

static int handle_pp_identifier(Context *ctx)
{
    if (ctx->recursion_count++ >= 256)  // !!! FIXME: gcc can figure this out.
    {
        fail(ctx, "Recursing macros");
        return 0;
    } // if

    IncludeState *state = ctx->include_stack;
    const char *fname = state->filename;
    const unsigned int line = state->line;
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    // Is this identifier #defined?
    const Define *def = find_define(ctx, sym);
    if (def == NULL)
        return 0;   // just send the token through unchanged.
    else if (def->paramcount != 0)
        return handle_macro_args(ctx, sym, def);

    const size_t deflen = strlen(def->definition);
    return push_source(ctx, fname, def->definition, deflen, line, NULL);
}